

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O1

void __thiscall OpenMD::P2Z::process(P2Z *this)

{
  SelectionManager *this_00;
  int *piVar1;
  long *plVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  SimInfo *info;
  uint i_2;
  int iVar7;
  int iVar8;
  StuntDouble *pSVar9;
  SelectionSet *pSVar10;
  StuntDouble *pSVar11;
  uint i_1;
  pointer *ppOVar12;
  uint i;
  uint whichFrame;
  pointer *ppOVar13;
  long lVar14;
  long lVar15;
  double (*__return_storage_ptr__) [3];
  double tmp;
  Vector<double,_3U> result_1;
  int jj;
  SquareMatrix3<double> result;
  int ii;
  DumpReader reader;
  Vector3d local_13a8;
  uint local_138c;
  double local_1388 [4];
  int local_1368;
  int local_1364;
  SelectionManager *local_1360;
  SelectionSet local_1358;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  double local_1308 [3];
  SelectionEvaluator *local_12f0;
  SelectionEvaluator *local_12e8;
  int local_12dc;
  double local_12d8 [10];
  DumpReader local_1288;
  
  local_1308[2] = (double)OpenMD::V3Zero._16_8_;
  local_1308[0] = (double)OpenMD::V3Zero._0_8_;
  local_1308[1] = (double)OpenMD::V3Zero._8_8_;
  local_1308[*(uint *)&(this->super_P2R).field_0xd64] = 1.0;
  info = (this->super_P2R).super_StaticAnalyser.info_;
  cVar6 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_P2R).super_StaticAnalyser.dumpFilename_);
  local_1368 = DumpReader::getNFrames(&local_1288);
  (this->super_P2R).nProcessed_ = local_1368 / (this->super_P2R).super_StaticAnalyser.step_;
  (this->super_P2R).P2_ = 0.0;
  (this->super_P2R).count_ = 0;
  if (0 < local_1368) {
    local_12e8 = &(this->super_P2R).evaluator1_;
    local_12f0 = &(this->super_P2R).evaluator2_;
    this_00 = &(this->super_P2R).seleMan1_;
    local_1360 = &(this->super_P2R).seleMan2_;
    whichFrame = 0;
    do {
      local_138c = whichFrame;
      DumpReader::readFrame(&local_1288,whichFrame);
      (this->super_P2R).currentSnapshot_ =
           ((this->super_P2R).super_StaticAnalyser.info_)->sman_->currentSnapshot_;
      if ((this->super_P2R).evaluator1_.isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1358,local_12e8);
        lVar15 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->super_P2R).seleMan1_.ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar15),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1358.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar15));
          lVar15 = lVar15 + 0x28;
        } while (lVar15 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1358.bitsets_);
      }
      if ((this->super_P2R).doVect_ == true) {
        pSVar9 = SelectionManager::beginSelected(this_00,&local_12dc);
        while (pSVar9 != (StuntDouble *)0x0) {
          if (pSVar9->objType_ - otDAtom < 2) {
            __return_storage_ptr__ = (double (*) [3])local_12d8;
            StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,pSVar9);
            local_1328 = 0;
            uStack_1320 = 0;
            local_1338 = 0;
            uStack_1330 = 0;
            local_1358.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uStack_1340 = 0;
            local_1358.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1358.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1318 = 0;
            ppOVar12 = (pointer *)&local_1358;
            lVar15 = 0;
            do {
              lVar14 = 0;
              ppOVar13 = ppOVar12;
              do {
                (((SelectionSet *)ppOVar13)->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][lVar14];
                lVar14 = lVar14 + 1;
                ppOVar13 = (pointer *)((long)ppOVar13 + 0x18);
              } while (lVar14 != 3);
              lVar15 = lVar15 + 1;
              ppOVar12 = ppOVar12 + 1;
              __return_storage_ptr__ = __return_storage_ptr__ + 1;
            } while (lVar15 != 3);
            local_1388[0] = 0.0;
            local_1388[1] = 0.0;
            local_1388[2] = 0.0;
            pSVar10 = &local_1358;
            lVar15 = 0;
            do {
              dVar4 = local_1388[lVar15];
              lVar14 = 0;
              do {
                dVar4 = dVar4 + *(double *)
                                 ((long)&(pSVar10->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar14) *
                                *(double *)((long)&OpenMD::V3Z + lVar14);
                lVar14 = lVar14 + 8;
              } while (lVar14 != 0x18);
              local_1388[lVar15] = dVar4;
              lVar15 = lVar15 + 1;
              pSVar10 = pSVar10 + 1;
            } while (lVar15 != 3);
            local_13a8.super_Vector<double,_3U>.data_[2] = local_1388[2];
            local_13a8.super_Vector<double,_3U>.data_[0] = local_1388[0];
            local_13a8.super_Vector<double,_3U>.data_[1] = local_1388[1];
            dVar4 = 0.0;
            lVar15 = 0;
            do {
              dVar5 = local_13a8.super_Vector<double,_3U>.data_[lVar15];
              dVar4 = dVar4 + dVar5 * dVar5;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            if (dVar4 < 0.0) {
              dVar4 = sqrt(dVar4);
            }
            else {
              dVar4 = SQRT(dVar4);
            }
            lVar15 = 0;
            do {
              local_13a8.super_Vector<double,_3U>.data_[lVar15] =
                   local_13a8.super_Vector<double,_3U>.data_[lVar15] / dVar4;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            dVar4 = 0.0;
            lVar15 = 0;
            do {
              dVar4 = dVar4 + local_1308[lVar15] * local_13a8.super_Vector<double,_3U>.data_[lVar15]
              ;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            (this->super_P2R).P2_ = (dVar4 * 3.0 * dVar4 + -1.0) * 0.5 + (this->super_P2R).P2_;
            piVar1 = &(this->super_P2R).count_;
            *piVar1 = *piVar1 + 1;
          }
          pSVar9 = SelectionManager::nextSelected(this_00,&local_12dc);
        }
      }
      else if ((this->super_P2R).doOffset_ == true) {
        pSVar9 = SelectionManager::beginSelected(this_00,&local_12dc);
        while (pSVar9 != (StuntDouble *)0x0) {
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pSVar11 = pSVar9;
          if ((this->super_P2R).doOffset2_ == true) {
            pSVar11 = SimInfo::getIOIndexToIntegrableObject
                                ((this->super_P2R).super_StaticAnalyser.info_,
                                 (this->super_P2R).seleOffset2_ + pSVar9->globalIndex_);
          }
          lVar15 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)(lVar15 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
          plVar2 = (long *)(lVar15 + (long)pSVar11->localIndex_ * 0x18);
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar2;
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar2[1];
          pSVar9 = SimInfo::getIOIndexToIntegrableObject
                             ((this->super_P2R).super_StaticAnalyser.info_,
                              (this->super_P2R).seleOffset_ + pSVar9->globalIndex_);
          lVar15 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_);
          local_12d8[2] = *(double *)(lVar15 + 0x10 + (long)pSVar9->localIndex_ * 0x18);
          pdVar3 = (double *)(lVar15 + (long)pSVar9->localIndex_ * 0x18);
          local_12d8[0] = *pdVar3;
          local_12d8[1] = pdVar3[1];
          local_1388[0] = 0.0;
          local_1388[1] = 0.0;
          local_1388[2] = 0.0;
          lVar15 = 0;
          do {
            local_1388[lVar15] =
                 (double)(&local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar15] - local_12d8[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_13a8.super_Vector<double,_3U>.data_[2] = local_1388[2];
          local_13a8.super_Vector<double,_3U>.data_[0] = local_1388[0];
          local_13a8.super_Vector<double,_3U>.data_[1] = local_1388[1];
          if (cVar6 != '\0') {
            Snapshot::wrapVector((this->super_P2R).currentSnapshot_,&local_13a8);
          }
          dVar4 = 0.0;
          lVar15 = 0;
          do {
            dVar5 = local_13a8.super_Vector<double,_3U>.data_[lVar15];
            dVar4 = dVar4 + dVar5 * dVar5;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          lVar15 = 0;
          do {
            local_13a8.super_Vector<double,_3U>.data_[lVar15] =
                 local_13a8.super_Vector<double,_3U>.data_[lVar15] / dVar4;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          dVar4 = 0.0;
          lVar15 = 0;
          do {
            dVar4 = dVar4 + local_1308[lVar15] * local_13a8.super_Vector<double,_3U>.data_[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          (this->super_P2R).P2_ = (dVar4 * 3.0 * dVar4 + -1.0) * 0.5 + (this->super_P2R).P2_;
          piVar1 = &(this->super_P2R).count_;
          *piVar1 = *piVar1 + 1;
          pSVar9 = SelectionManager::nextSelected(this_00,&local_12dc);
        }
      }
      else {
        if ((this->super_P2R).evaluator2_.isDynamic_ == true) {
          SelectionEvaluator::evaluate(&local_1358,local_12f0);
          lVar15 = 0;
          do {
            std::vector<bool,_std::allocator<bool>_>::operator=
                      ((vector<bool,_std::allocator<bool>_> *)
                       ((long)&(((this->super_P2R).seleMan2_.ss_.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar15),
                       (vector<bool,_std::allocator<bool>_> *)
                       ((long)&((local_1358.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar15));
            lVar15 = lVar15 + 0x28;
          } while (lVar15 != 0xf0);
          std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                    (&local_1358.bitsets_);
        }
        iVar7 = OpenMDBitSet::countBits
                          ((this->super_P2R).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        iVar8 = OpenMDBitSet::countBits
                          ((this->super_P2R).seleMan2_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (iVar7 != iVar8) {
          snprintf(painCave.errMsg,2000,
                   "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                   ,(ulong)local_138c);
          painCave.isFatal = 0;
          painCave.severity = 3;
          simError();
        }
        pSVar9 = SelectionManager::beginSelected(this_00,&local_12dc);
        pSVar11 = SelectionManager::beginSelected(local_1360,&local_1364);
        while ((pSVar11 != (StuntDouble *)0x0 && (pSVar9 != (StuntDouble *)0x0))) {
          lVar15 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_);
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)(lVar15 + 0x10 + (long)pSVar9->localIndex_ * 0x18);
          plVar2 = (long *)(lVar15 + (long)pSVar9->localIndex_ * 0x18);
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar2;
          local_1358.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar2[1];
          lVar15 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
          local_12d8[2] = *(double *)(lVar15 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
          pdVar3 = (double *)(lVar15 + (long)pSVar11->localIndex_ * 0x18);
          local_12d8[0] = *pdVar3;
          local_12d8[1] = pdVar3[1];
          local_1388[0] = 0.0;
          local_1388[1] = 0.0;
          local_1388[2] = 0.0;
          lVar15 = 0;
          do {
            local_1388[lVar15] =
                 (double)(&local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar15] - local_12d8[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_13a8.super_Vector<double,_3U>.data_[2] = local_1388[2];
          local_13a8.super_Vector<double,_3U>.data_[0] = local_1388[0];
          local_13a8.super_Vector<double,_3U>.data_[1] = local_1388[1];
          if (cVar6 != '\0') {
            Snapshot::wrapVector((this->super_P2R).currentSnapshot_,&local_13a8);
          }
          dVar4 = 0.0;
          lVar15 = 0;
          do {
            dVar5 = local_13a8.super_Vector<double,_3U>.data_[lVar15];
            dVar4 = dVar4 + dVar5 * dVar5;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          lVar15 = 0;
          do {
            local_13a8.super_Vector<double,_3U>.data_[lVar15] =
                 local_13a8.super_Vector<double,_3U>.data_[lVar15] / dVar4;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          dVar4 = 0.0;
          lVar15 = 0;
          do {
            dVar4 = dVar4 + local_1308[lVar15] * local_13a8.super_Vector<double,_3U>.data_[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          (this->super_P2R).P2_ = (dVar4 * 3.0 * dVar4 + -1.0) * 0.5 + (this->super_P2R).P2_;
          piVar1 = &(this->super_P2R).count_;
          *piVar1 = *piVar1 + 1;
          pSVar9 = SelectionManager::nextSelected(this_00,&local_12dc);
          pSVar11 = SelectionManager::nextSelected(local_1360,&local_1364);
        }
      }
      whichFrame = local_138c + (this->super_P2R).super_StaticAnalyser.step_;
    } while ((int)whichFrame < local_1368);
  }
  iVar7 = (this->super_P2R).count_;
  if (0 < iVar7) {
    (this->super_P2R).P2_ = (this->super_P2R).P2_ / (double)iVar7;
  }
  P2R::writeP2R(&this->super_P2R);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void P2Z::process() {
    Vector3d zhat = V3Zero;
    zhat[axis_]   = 1.0;  // unit vector along preferred axis

    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;
    P2_         = 0.0;
    count_      = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            RealType cosangle = dot(zhat, vec);

            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = sd1A->getPos();
            } else {
              r1 = sd1->getPos();
            }

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1  = sd1->getPos();
            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      }
    }
    processHistogram();
    writeP2R();
  }